

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

int utils::scanDir(string path,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *ret)

{
  DIR *__dirp;
  dirent *pdVar1;
  size_t sVar2;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  char local_98 [112];
  
  __dirp = opendir((char *)ret);
  pdVar1 = readdir(__dirp);
  if (pdVar1 != (dirent *)0x0) {
    do {
      strcpy(local_98,pdVar1->d_name);
      if (local_98[0] != '.') {
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        sVar2 = strlen(local_98);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,local_98,local_98 + sVar2);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(in_RSI,&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
      }
      pdVar1 = readdir(__dirp);
    } while (pdVar1 != (dirent *)0x0);
  }
  closedir(__dirp);
  return (int)((ulong)(*(long *)(in_RSI + 8) - *(long *)in_RSI) >> 5);
}

Assistant:

static inline int scanDir(std::string path, std::vector<std::string> &ret) {
  DIR *dir;
  struct dirent *rent;
  dir = opendir(path.c_str());
  char s[100];
  while ((rent = readdir(dir))) {
    strcpy(s, rent->d_name);
    if (s[0] != '.') {
      ret.push_back(s);
    }
  }
  closedir(dir);
  return ret.size();
}